

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

void __thiscall Assimp::FIShortValueImpl::~FIShortValueImpl(FIShortValueImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer psVar3;
  
  (this->super_FIShortValue).super_FIValue._vptr_FIValue =
       (_func_int **)&PTR_toString_abi_cxx11__008d0198;
  pcVar2 = (this->strValue)._M_dataplus._M_p;
  paVar1 = &(this->strValue).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_FIShortValue).super_FIValue._vptr_FIValue =
       (_func_int **)&PTR___cxa_pure_virtual_008d01f0;
  psVar3 = (this->super_FIShortValue).value.super__Vector_base<short,_std::allocator<short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (psVar3 != (pointer)0x0) {
    operator_delete(psVar3,(long)(this->super_FIShortValue).value.
                                 super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)psVar3);
    return;
  }
  return;
}

Assistant:

inline FIShortValueImpl(std::vector<int16_t> &&value_): strValueValid(false) { value = std::move(value_); }